

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void basisu::vector<basisu::image>::object_mover(void *pDst_void,void *pSrc_void,uint32_t num)

{
  long lVar1;
  
  for (lVar1 = (ulong)num << 5; lVar1 != 0; lVar1 = lVar1 + -0x20) {
    image::image((image *)pDst_void,(image *)pSrc_void);
    vector<basisu::color_rgba>::~vector(&((image *)pSrc_void)->m_pixels);
    pSrc_void = (void *)((long)pSrc_void + 0x20);
    pDst_void = (void *)((long)pDst_void + 0x20);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint32_t num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            // placement new
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            ++pSrc;
            ++pDst;
         }
      }